

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O1

JointIndex __thiscall iDynTree::Model::getJointIndex(Model *this,string *jointName)

{
  pointer __s1;
  size_t __n;
  int iVar1;
  ostream *poVar2;
  size_type *psVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  stringstream ss;
  long *local_1d8;
  long local_1c8 [2];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  lVar4 = (long)(this->joints).
                super__Vector_base<iDynTree::IJoint_*,_std::allocator<iDynTree::IJoint_*>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->joints).
                super__Vector_base<iDynTree::IJoint_*,_std::allocator<iDynTree::IJoint_*>_>._M_impl.
                super__Vector_impl_data._M_start;
  bVar7 = lVar4 != 0;
  if (bVar7) {
    uVar5 = lVar4 >> 3;
    __s1 = (jointName->_M_dataplus)._M_p;
    __n = jointName->_M_string_length;
    psVar3 = &((this->jointNames).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
    uVar6 = 0;
    do {
      if ((__n == *psVar3) &&
         ((__n == 0 ||
          (iVar1 = bcmp(__s1,(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (psVar3 + -1))->_M_dataplus)._M_p,__n), iVar1 == 0)))) {
        if (bVar7) {
          return uVar6;
        }
        break;
      }
      uVar6 = uVar6 + 1;
      bVar7 = uVar6 < uVar5;
      psVar3 = psVar3 + 4;
    } while (uVar5 + (uVar5 == 0) != uVar6);
  }
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"jointName ",10);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,(jointName->_M_dataplus)._M_p,jointName->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," not found in the model.",0x18);
  std::__cxx11::stringbuf::str();
  iDynTree::reportError("Model","getJointIndex",(char *)local_1d8);
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8,local_1c8[0] + 1);
  }
  uVar5 = JOINT_INVALID_INDEX;
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return uVar5;
}

Assistant:

JointIndex Model::getJointIndex(const std::string& jointName) const
{
    for(size_t i=0; i < this->getNrOfJoints(); i++ )
    {
        if( jointName == jointNames[i] )
        {
            return i;
        }
    }

    std::stringstream ss;
    ss << "jointName " << jointName << " not found in the model.";
    reportError("Model","getJointIndex",ss.str().c_str());

    return JOINT_INVALID_INDEX;
}